

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

void __thiscall Worker::Run(Worker *this)

{
  int __fd;
  ssize_t sVar1;
  sockaddr local_58;
  string local_48;
  
  local_58.sa_data[6] = '\0';
  local_58.sa_data[7] = '\0';
  local_58.sa_data[8] = '\0';
  local_58.sa_data[9] = '\0';
  local_58.sa_data[10] = '\0';
  local_58.sa_data[0xb] = '\0';
  local_58.sa_data[0xc] = '\0';
  local_58.sa_data[0xd] = '\0';
  __fd = socket(2,2,0);
  if (__fd < 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Error: Creating socket.","");
    safe_cout(this,&local_48);
  }
  else {
    local_58.sa_family = 2;
    local_58.sa_data._0_2_ = this->port_ << 8 | this->port_ >> 8;
    local_58.sa_data._2_4_ = inet_addr(this->dest_);
    sVar1 = sendto(__fd,cflow_cap,700,0,&local_58,0x10);
    if (-1 < sVar1) {
      do {
        LOCK();
        (this->requests_->super___atomic_base<unsigned_long>)._M_i =
             (this->requests_->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        sVar1 = sendto(__fd,cflow_cap,700,0,&local_58,0x10);
      } while (-1 < sVar1);
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Error: Sent failed.","");
    safe_cout(this,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  exit(1);
}

Assistant:

void Worker::Run() {

    int sd;
    struct sockaddr_in addr{};

    if ((sd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
        safe_cout("Error: Creating socket.");
        exit(EXIT_FAILURE);
    }

    addr.sin_family = AF_INET;
    addr.sin_port = htons ((short) (size_t) port_);
    addr.sin_addr.s_addr = inet_addr(dest_);

    while (true) {
        if (sendto(sd, &cflow_cap, sizeof(cflow_cap), 0,
                   (struct sockaddr *) &addr, sizeof(addr)) < 0) {
            safe_cout("Error: Sent failed.");
            exit(EXIT_FAILURE);
        }
        requests_->fetch_add(1);
    }

    close(sd);

}